

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

insert_return_type * __thiscall
phmap::priv::
btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
::insert(insert_return_type *__return_storage_ptr__,
        btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
        *this,node_type *node)

{
  iterator iVar1;
  pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>,_bool>
  res;
  pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>,_bool>
  local_38;
  aligned_storage_t<sizeof(slot_type),_alignof(slot_type)> *local_20;
  
  if ((node->
      super_node_handle_base<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_std::allocator<int>_>
      ).alloc_.super__Optional_base<std::allocator<int>,_false,_false>._M_payload.
      super__Optional_payload<std::allocator<int>,_true,_false,_false>.
      super__Optional_payload_base<std::allocator<int>_>._M_engaged == false) {
    iVar1 = btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
            ::end((btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
                   *)this);
    (__return_storage_ptr__->position).node = iVar1.node;
    (__return_storage_ptr__->position).position = iVar1.position;
    __return_storage_ptr__->inserted = false;
    *(bool *)((long)&(__return_storage_ptr__->node).
                     super_node_handle_base<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_std::allocator<int>_>
                     .alloc_.super__Optional_base<std::allocator<int>,_false,_false>._M_payload.
                     super__Optional_payload<std::allocator<int>,_true,_false,_false>.
                     super__Optional_payload_base<std::allocator<int>_> + 1) = false;
  }
  else {
    local_20 = &(node->
                super_node_handle_base<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_std::allocator<int>_>
                ).slot_space_;
    btree<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>::
    insert_unique<int*>(&local_38,
                        (btree<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>
                         *)this,(key_type *)local_20,(int **)&local_20);
    if (local_38.second == true) {
      if ((node->
          super_node_handle_base<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_std::allocator<int>_>
          ).alloc_.super__Optional_base<std::allocator<int>,_false,_false>._M_payload.
          super__Optional_payload<std::allocator<int>,_true,_false,_false>.
          super__Optional_payload_base<std::allocator<int>_>._M_engaged == true) {
        (node->
        super_node_handle_base<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_std::allocator<int>_>
        ).alloc_.super__Optional_base<std::allocator<int>,_false,_false>._M_payload.
        super__Optional_payload<std::allocator<int>,_true,_false,_false>.
        super__Optional_payload_base<std::allocator<int>_>._M_engaged = false;
      }
      (__return_storage_ptr__->position).position = local_38.first.position;
      (__return_storage_ptr__->position).node = local_38.first.node;
      __return_storage_ptr__->inserted = true;
      *(bool *)((long)&(__return_storage_ptr__->node).
                       super_node_handle_base<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_std::allocator<int>_>
                       .alloc_.super__Optional_base<std::allocator<int>,_false,_false>._M_payload.
                       super__Optional_payload<std::allocator<int>,_true,_false,_false>.
                       super__Optional_payload_base<std::allocator<int>_> + 1) = false;
    }
    else {
      (__return_storage_ptr__->position).position = local_38.first.position;
      (__return_storage_ptr__->position).node = local_38.first.node;
      __return_storage_ptr__->inserted = false;
      *(bool *)((long)&(__return_storage_ptr__->node).
                       super_node_handle_base<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_std::allocator<int>_>
                       .alloc_.super__Optional_base<std::allocator<int>,_false,_false>._M_payload.
                       super__Optional_payload<std::allocator<int>,_true,_false,_false>.
                       super__Optional_payload_base<std::allocator<int>_> + 1) = false;
      node_handle_base<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_std::allocator<int>_>
      ::operator=(&(__return_storage_ptr__->node).
                   super_node_handle_base<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_std::allocator<int>_>
                  ,&node->
                    super_node_handle_base<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_std::allocator<int>_>
                 );
    }
  }
  return __return_storage_ptr__;
}

Assistant:

insert_return_type insert(node_type &&node) {
            if (!node) return {this->end(), false, node_type()};
            std::pair<iterator, bool> res =
                this->tree_.insert_unique(params_type::key(CommonAccess::GetSlot(node)),
                                          CommonAccess::GetSlot(node));
            if (res.second) {
                CommonAccess::Destroy(&node);
                return {res.first, true, node_type()};
            } else {
                return {res.first, false, std::move(node)};
            }
        }